

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

PolylineSegmentedPathwaySingleRadius * anon_unknown.dwarf_70a26::getTestPath(void)

{
  PolylineSegmentedPathwaySingleRadius *points;
  Vec3 pathPoints [16];
  size_type pathPointCount;
  float pathRadius;
  size_type in_stack_fffffffffffffed8;
  PolylineSegmentedPathwaySingleRadius *in_stack_fffffffffffffee0;
  Vec3 local_d8;
  Vec3 local_cc;
  Vec3 local_c0;
  Vec3 local_b4;
  Vec3 local_a8;
  Vec3 local_9c;
  Vec3 local_90;
  Vec3 local_84;
  Vec3 local_78;
  Vec3 local_6c;
  Vec3 local_60;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  Vec3 local_30;
  Vec3 local_24;
  undefined8 local_10;
  undefined4 local_4;
  
  if ((anonymous_namespace)::gTestPath == (PolylineSegmentedPathwaySingleRadius *)0x0) {
    local_4 = 0x40000000;
    local_10 = 0x10;
    OpenSteer::Vec3::Vec3(&local_d8,-12.67873,0.014429,0.523286);
    OpenSteer::Vec3::Vec3(&local_cc,-10.44764,0.014927,-3.441384);
    OpenSteer::Vec3::Vec3(&local_c0,-5.889884,0.012829,-4.171758);
    OpenSteer::Vec3::Vec3(&local_b4,0.941264,0.003302,0.350514);
    OpenSteer::Vec3::Vec3(&local_a8,5.834848,-0.004077,6.562436);
    OpenSteer::Vec3::Vec3(&local_9c,11.014415,-0.011118,10.175158);
    OpenSteer::Vec3::Vec3(&local_90,15.962142,-0.012995,8.823643);
    OpenSteer::Vec3::Vec3(&local_84,18.697884,-0.010231,2.420847);
    OpenSteer::Vec3::Vec3(&local_78,16.055256,-0.005065,-3.571535);
    OpenSteer::Vec3::Vec3(&local_6c,10.545015,0.002845,-9.926839);
    OpenSteer::Vec3::Vec3(&local_60,5.883745,0.006835,-8.513931);
    OpenSteer::Vec3::Vec3(&local_54,3.1779,0.004197,-2.331299);
    OpenSteer::Vec3::Vec3(&local_48,1.943718,0.001018,2.786566);
    OpenSteer::Vec3::Vec3(&local_3c,-1.049675,0.000868,5.571142);
    OpenSteer::Vec3::Vec3(&local_30,-7.581115,0.006343,6.136619);
    OpenSteer::Vec3::Vec3(&local_24,-12.411138,0.010856,3.567094);
    OpenSteer::Vec3::operator=((Vec3 *)(anonymous_namespace)::gEndpoint0,&local_d8);
    OpenSteer::Vec3::operator=((Vec3 *)(anonymous_namespace)::gEndpoint1,&local_24);
    points = (PolylineSegmentedPathwaySingleRadius *)operator_new(0x68);
    OpenSteer::PolylineSegmentedPathwaySingleRadius::PolylineSegmentedPathwaySingleRadius
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(Vec3 *)points,
               (float)((ulong)&local_d8 >> 0x20),SUB81((ulong)&local_d8 >> 0x18,0));
    (anonymous_namespace)::gTestPath = points;
  }
  return (anonymous_namespace)::gTestPath;
}

Assistant:

PolylineSegmentedPathwaySingleRadius* getTestPath (void)
{
    if (gTestPath == NULL)
    {
        const float pathRadius = 2;
        
        const PolylineSegmentedPathwaySingleRadius::size_type pathPointCount = 16;
        // const float size = 30;
        const Vec3 pathPoints[pathPointCount] = {
            Vec3( -12.678730011f, 0.0144290002063f, 0.523285984993f ),
            Vec3( -10.447640419f, 0.0149269998074f, -3.44138407707f ),
            Vec3( -5.88988399506f, 0.0128290001303f, -4.1717581749f ),
            Vec3( 0.941263973713f, 0.00330199999735f, 0.350513994694f ),
            Vec3( 5.83484792709f, -0.00407700007781f, 6.56243610382f ),
            Vec3( 11.0144147873f, -0.0111180003732f, 10.175157547f ),
            Vec3( 15.9621419907f, -0.0129949999973f, 8.82364273071f ),
            Vec3( 18.697883606f, -0.0102310003713f, 2.42084693909f ),
            Vec3( 16.0552558899f, -0.00506500015035f, -3.57153511047f ),
            Vec3( 10.5450153351f, 0.00284500000998f, -9.92683887482f ),
            Vec3( 5.88374519348f, 0.00683500012383f, -8.51393127441f ),
            Vec3( 3.17790007591f, 0.00419700006023f, -2.33129906654f ),
            Vec3( 1.94371795654f, 0.00101799995173f, 2.78656601906f ),
            Vec3( -1.04967498779f, 0.000867999973707f, 5.57114219666f ),
            Vec3( -7.58111476898f, 0.00634300010279f, 6.13661909103f ),
            Vec3( -12.4111375809f, 0.0108559997752f, 3.5670940876f )
        };
        
        

        
        // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
        
        gEndpoint0 = pathPoints[0];
        gEndpoint1 = pathPoints[pathPointCount-1];
        
        gTestPath = new PolylineSegmentedPathwaySingleRadius (pathPointCount,
                                                              pathPoints,
                                                              pathRadius,
                                                              false);
    }
    return gTestPath;
}